

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void __thiscall acto::core::runtime_t::execute(runtime_t *this)

{
  workers_t *pwVar1;
  mpsc_stack<acto::core::worker_t> *pmVar2;
  __pointer_type pwVar3;
  worker_t *pwVar4;
  bool bVar5;
  __pid_t _Var6;
  __pointer_type pwVar7;
  object_t *obj;
  long lVar8;
  long lVar9;
  void *__stat_loc;
  long local_50;
  
  local_50 = std::chrono::_V2::steady_clock::now();
  if (((this->active_)._M_base._M_i & 1U) != 0) {
    pwVar1 = &this->workers_;
    lVar9 = 2;
LAB_0010629c:
    do {
      bVar5 = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::empty
                        (&this->queue_);
      if (!bVar5) {
        do {
          pwVar7 = (this->workers_).idle.head_._M_b._M_p;
          if (pwVar7 == (__pointer_type)0x0) {
            if ((this->workers_).count.super___atomic_base<unsigned_long>._M_i <
                (this->workers_).reserved.super___atomic_base<unsigned_long>._M_i +
                this->m_processors) goto LAB_001062ec;
            __stat_loc = (void *)(lVar9 * 1000000000);
            _Var6 = event::wait(&this->idle_workers_event_,__stat_loc);
            goto LAB_0010630a;
          }
          pmVar2 = &(this->workers_).idle;
          LOCK();
          bVar5 = pwVar7 == (pmVar2->head_)._M_b._M_p;
          if (bVar5) {
            (pmVar2->head_)._M_b._M_p = (pwVar7->super_node<acto::core::worker_t>).next;
          }
          UNLOCK();
        } while (!bVar5);
        (pwVar7->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
        goto LAB_00106367;
      }
      if ((((this->terminating_)._M_base._M_i & 1U) == 0) &&
         (_Var6 = event::wait(&this->queue_event_,(void *)0xdf8475800), _Var6 != 2)) {
        lVar8 = std::chrono::_V2::steady_clock::now();
        if (60000000000 < lVar8 - local_50) {
          do {
            pwVar4 = (this->workers_).idle.head_._M_b._M_p;
            if (pwVar4 == (worker_t *)0x0) goto LAB_00106493;
            pmVar2 = &(this->workers_).idle;
            LOCK();
            bVar5 = pwVar4 == (pmVar2->head_)._M_b._M_p;
            if (bVar5) {
              (pmVar2->head_)._M_b._M_p = (pwVar4->super_node<acto::core::worker_t>).next;
            }
            UNLOCK();
          } while (!bVar5);
          (pwVar4->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
          worker_t::~worker_t(pwVar4);
          operator_delete(pwVar4,0x98);
          LOCK();
          (pwVar1->count).super___atomic_base<unsigned_long>._M_i =
               (pwVar1->count).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          if ((pwVar1->count).super___atomic_base<unsigned_long>._M_i == 0) {
            event::signaled(&this->no_workers_event_);
          }
LAB_00106493:
          local_50 = std::chrono::_V2::steady_clock::now();
        }
      }
      else {
        do {
          pwVar7 = (this->workers_).idle.head_._M_b._M_p;
          if (pwVar7 == (__pointer_type)0x0) goto LAB_00106420;
          pmVar2 = &(this->workers_).idle;
          LOCK();
          bVar5 = pwVar7 == (pmVar2->head_)._M_b._M_p;
          if (bVar5) {
            (pmVar2->head_)._M_b._M_p = (__pointer_type)0x0;
          }
          UNLOCK();
        } while (!bVar5);
        do {
          pwVar4 = (pwVar7->super_node<acto::core::worker_t>).next;
          (pwVar7->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
          worker_t::~worker_t(pwVar7);
          operator_delete(pwVar7,0x98);
          LOCK();
          (pwVar1->count).super___atomic_base<unsigned_long>._M_i =
               (pwVar1->count).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          if ((pwVar1->count).super___atomic_base<unsigned_long>._M_i == 0) {
            event::signaled(&this->no_workers_event_);
          }
          pwVar7 = pwVar4;
        } while (pwVar4 != (worker_t *)0x0);
      }
LAB_00106420:
    } while (((this->active_)._M_base._M_i & 1U) != 0);
  }
  return;
  while( true ) {
    pmVar2 = &(this->workers_).idle;
    LOCK();
    bVar5 = pwVar7 == (pmVar2->head_)._M_b._M_p;
    if (bVar5) {
      (pmVar2->head_)._M_b._M_p = (pwVar7->super_node<acto::core::worker_t>).next;
    }
    UNLOCK();
    if (bVar5) break;
LAB_0010630a:
    pwVar7 = (this->workers_).idle.head_._M_b._M_p;
    if (pwVar7 == (worker_t *)0x0) {
      if (_Var6 != 2) goto LAB_00106352;
      lVar9 = lVar9 + 2;
      if ((pwVar1->count).super___atomic_base<unsigned_long>._M_i < 0x200) goto LAB_001062ec;
      event::wait(&this->idle_workers_event_,__stat_loc);
      goto LAB_0010629c;
    }
  }
  (pwVar7->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
LAB_00106352:
  if (2 < lVar9) {
    lVar9 = lVar9 + -2;
  }
LAB_0010635e:
  if (pwVar7 != (worker_t *)0x0) {
LAB_00106367:
    obj = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop(&this->queue_);
    if (obj == (object_t *)0x0) {
      do {
        pwVar3 = (this->workers_).idle.head_._M_b._M_p;
        (pwVar7->super_node<acto::core::worker_t>).next = pwVar3;
        pmVar2 = &(this->workers_).idle;
        LOCK();
        bVar5 = pwVar3 == (pmVar2->head_)._M_b._M_p;
        if (bVar5) {
          (pmVar2->head_)._M_b._M_p = pwVar7;
        }
        UNLOCK();
      } while (!bVar5);
    }
    else {
      worker_t::assign(pwVar7,obj,(duration)0x1dcd6500);
    }
  }
  goto LAB_0010629c;
LAB_001062ec:
  pwVar7 = create_worker(this);
  goto LAB_0010635e;
}

Assistant:

void runtime_t::execute() {
  auto last_cleanup_time = std::chrono::steady_clock::now();
  auto new_worker_timeout = std::chrono::seconds(2);

  auto delete_worker = [this](worker_t* const item) {
    delete item;
    // Уведомить, что удалены все вычислительные потоки
    if (--workers_.count == 0) {
      no_workers_event_.signaled();
    }
  };

  while (active_) {
    while (!queue_.empty()) {
      // Прежде чем извлекать объект из очереди, необходимо проверить,
      // что есть вычислительные ресурсы для его обработки
      worker_t* worker = workers_.idle.pop();

      if (!worker) {
        // Если текущее количество потоков меньше оптимального,
        // то создать новый поток
        if (workers_.count < (workers_.reserved + m_processors)) {
          worker = create_worker();
        } else {
          // Подождать некоторое время осовобождения какого-нибудь потока
          const wait_result result =
            idle_workers_event_.wait(new_worker_timeout);

          worker = workers_.idle.pop();

          if (!worker && (result == wait_result::timeout)) {
            new_worker_timeout += std::chrono::seconds(2);

            if (workers_.count < MAX_WORKERS) {
              worker = create_worker();
            } else {
              idle_workers_event_.wait();
            }
          } else if (new_worker_timeout > std::chrono::seconds(2)) {
            new_worker_timeout -= std::chrono::seconds(2);
          }
        }
      }

      if (worker) {
        if (object_t* const obj = queue_.pop()) {
          worker->assign(obj, std::chrono::milliseconds(500));
        } else {
          workers_.idle.push(worker);
        }
      }
    }

    if (terminating_ ||
        (queue_event_.wait(std::chrono::seconds(60)) == wait_result::timeout))
    {
      auto idle_workers = workers_.idle.extract();
      // Stop all idle threads.
      while (worker_t* const item = idle_workers.pop_front()) {
        delete_worker(item);
      }
    } else if ((std::chrono::steady_clock::now() - last_cleanup_time) >
               std::chrono::seconds(60))
    {
      if (worker_t* const item = workers_.idle.pop()) {
        delete_worker(item);
      }

      last_cleanup_time = std::chrono::steady_clock::now();
    }
  }
}